

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O0

coop_t * __thiscall
so_5::impl::coop_repository_basis_t::find_parent_coop_if_necessary
          (coop_repository_basis_t *this,coop_t *coop_to_be_registered)

{
  bool bVar1;
  string *__x;
  pointer ppVar2;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  _Self local_30;
  _Self local_28;
  const_iterator it;
  coop_t *coop_to_be_registered_local;
  coop_repository_basis_t *this_local;
  
  it._M_node = (_Base_ptr)coop_to_be_registered;
  bVar1 = coop_t::has_parent_coop(coop_to_be_registered);
  if (bVar1) {
    __x = coop_t::parent_coop_name_abi_cxx11_((coop_t *)it._M_node);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
         ::find(&this->m_registered_coop,__x);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
         ::end(&this->m_registered_coop);
    bVar1 = std::operator==(&local_30,&local_28);
    if (bVar1) {
      coop_t::parent_coop_name_abi_cxx11_((coop_t *)it._M_node);
      std::operator+((char *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "parent coop with name \"");
      std::operator+(local_50,(char *)local_70);
      exception_t::raise(0x51ca43);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string(local_70);
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>
             ::operator->(&local_28);
    this_local = (coop_repository_basis_t *)
                 std::__shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(ppVar2->second).
                             super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    this_local = (coop_repository_basis_t *)0x0;
  }
  return (coop_t *)this_local;
}

Assistant:

coop_t *
coop_repository_basis_t::find_parent_coop_if_necessary(
	const coop_t & coop_to_be_registered ) const
{
	if( coop_to_be_registered.has_parent_coop() )
	{
		auto it = m_registered_coop.find(
				coop_to_be_registered.parent_coop_name() );
		if( m_registered_coop.end() == it )
		{
			SO_5_THROW_EXCEPTION(
				rc_parent_coop_not_found,
				"parent coop with name \"" +
					coop_to_be_registered.parent_coop_name() +
					"\" is not registered" );
		}

		return it->second.get();
	}

	return nullptr;
}